

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini-gmp.c
# Opt level: O3

void mpz_gcdext(__mpz_struct *g,__mpz_struct *s,__mpz_struct *t,__mpz_struct *u,__mpz_struct *v)

{
  mp_limb_t *pmVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  ulong *puVar4;
  undefined8 uVar5;
  uint uVar6;
  long lVar7;
  __mpz_struct *p_Var8;
  int iVar9;
  mp_ptr __mp_ptr_swap__tmp;
  mp_bitcnt_t mVar10;
  mp_bitcnt_t mVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  mp_bitcnt_t bit_index;
  __mpz_struct *p_Var17;
  mp_bitcnt_t bits;
  long lVar18;
  mp_limb_t *pmVar19;
  ulong *puVar20;
  mpz_t s1;
  mpz_t tu;
  mpz_t t1;
  __mpz_struct local_c8;
  __mpz_struct local_b8;
  __mpz_struct local_a8;
  __mpz_struct local_98;
  __mpz_struct local_88;
  __mpz_struct local_78;
  __mpz_struct *local_60;
  __mpz_struct *local_58;
  __mpz_struct *local_50;
  __mpz_struct *local_48;
  mp_bitcnt_t local_40;
  __mpz_struct *local_38;
  
  iVar9 = u->_mp_size;
  iVar13 = v->_mp_size;
  if (iVar9 == 0) {
    mpz_set(g,v);
    iVar9 = g->_mp_size;
    iVar12 = -iVar9;
    if (0 < iVar9) {
      iVar12 = iVar9;
    }
    g->_mp_size = iVar12;
    if (s != (__mpz_struct *)0x0) {
      s->_mp_size = 0;
    }
    if (t == (__mpz_struct *)0x0) {
      return;
    }
    mpz_set_si(t,(long)(int)((uint)(iVar13 != 0) | iVar13 >> 0x1f));
    return;
  }
  if (iVar13 == 0) {
    mpz_set(g,u);
    iVar13 = g->_mp_size;
    iVar12 = -iVar13;
    if (0 < iVar13) {
      iVar12 = iVar13;
    }
    g->_mp_size = iVar12;
    if (s != (__mpz_struct *)0x0) {
      mpz_set_si(s,(long)(int)(iVar9 >> 0x1f | 1));
    }
    if (t == (__mpz_struct *)0x0) {
      return;
    }
    t->_mp_size = 0;
    return;
  }
  local_88._mp_alloc = 0;
  local_88._mp_size = 0;
  local_88._mp_d = &mpz_init::dummy_limb;
  local_a8._mp_alloc = 0;
  local_a8._mp_size = 0;
  local_a8._mp_d = &mpz_init::dummy_limb;
  local_c8._mp_alloc = 0;
  local_c8._mp_size = 0;
  local_c8._mp_d = &mpz_init::dummy_limb;
  local_98._mp_alloc = 0;
  local_98._mp_size = 0;
  local_98._mp_d = &mpz_init::dummy_limb;
  local_b8._mp_alloc = 0;
  local_b8._mp_size = 0;
  local_b8._mp_d = &mpz_init::dummy_limb;
  local_78._mp_alloc = 0;
  local_78._mp_size = 0;
  local_78._mp_d = &mpz_init::dummy_limb;
  local_60 = t;
  local_38 = g;
  mpz_set(&local_88,u);
  iVar9 = -local_88._mp_size;
  if (0 < local_88._mp_size) {
    iVar9 = local_88._mp_size;
  }
  local_88._mp_size = iVar9;
  mVar10 = mpz_make_odd(&local_88);
  local_58 = v;
  mpz_set(&local_a8,v);
  iVar9 = -local_a8._mp_size;
  if (0 < local_a8._mp_size) {
    iVar9 = local_a8._mp_size;
  }
  local_a8._mp_size = iVar9;
  mVar11 = mpz_make_odd(&local_a8);
  pmVar19 = local_88._mp_d;
  iVar9 = local_88._mp_size;
  local_40 = mVar11;
  if (mVar10 < mVar11) {
    local_40 = mVar10;
  }
  mVar10 = mVar10 - local_40;
  mVar11 = mVar11 - local_40;
  if (local_88._mp_size < local_a8._mp_size) {
    iVar13 = local_a8._mp_alloc;
    local_88._mp_d = local_a8._mp_d;
    local_a8._mp_d = pmVar19;
    local_88._mp_size = local_a8._mp_size;
    local_a8._mp_size = iVar9;
    local_a8._mp_alloc = local_88._mp_alloc;
    bit_index = mVar10;
    bits = mVar11;
    local_50 = s;
    local_48 = u;
    local_88._mp_alloc = iVar13;
  }
  else {
    local_48 = local_58;
    local_50 = local_60;
    bit_index = mVar11;
    bits = mVar10;
    local_60 = s;
    local_58 = u;
  }
  mpz_div_qr(&local_78,&local_88,&local_88,&local_a8,GMP_DIV_TRUNC);
  mpz_mul_2exp(&local_78,&local_78,bits);
  mpz_setbit(&local_98,bit_index);
  lVar18 = mVar11 + mVar10;
  if (local_88._mp_size < 1) {
    mpz_setbit(&local_b8,bits);
LAB_005d0c2d:
    iVar9 = 0;
  }
  else {
    mVar10 = mpz_make_odd(&local_88);
    mpz_setbit(&local_b8,bits + mVar10);
    lVar18 = lVar18 + mVar10;
    iVar9 = mpz_cmp(&local_88,&local_a8);
    if (iVar9 == 0) goto LAB_005d0c2d;
    do {
      if (iVar9 < 0) {
        mpz_sub(&local_a8,&local_a8,&local_88);
        mpz_add(&local_b8,&local_b8,&local_78);
        p_Var17 = &local_98;
        mpz_add(&local_c8,&local_c8,p_Var17);
        mVar10 = mpz_make_odd(&local_a8);
        mpz_mul_2exp(&local_78,&local_78,mVar10);
      }
      else {
        mpz_sub(&local_88,&local_88,&local_a8);
        mpz_add(&local_78,&local_b8,&local_78);
        mpz_add(&local_98,&local_c8,&local_98);
        mVar10 = mpz_make_odd(&local_88);
        mpz_mul_2exp(&local_b8,&local_b8,mVar10);
        p_Var17 = &local_c8;
      }
      mpz_mul_2exp(p_Var17,p_Var17,mVar10);
      lVar18 = lVar18 + mVar10;
      iVar9 = mpz_cmp(&local_88,&local_a8);
    } while (iVar9 != 0);
    iVar9 = local_c8._mp_size;
  }
  mpz_mul_2exp(&local_a8,&local_a8,local_40);
  local_c8._mp_size = -iVar9;
  mpz_div_qr(&local_98,(__mpz_struct *)0x0,local_48,&local_a8,GMP_DIV_TRUNC);
  iVar13 = -local_98._mp_size;
  if (0 < local_98._mp_size) {
    iVar13 = local_98._mp_size;
  }
  local_98._mp_size = iVar13;
  mpz_div_qr(&local_78,(__mpz_struct *)0x0,local_58,&local_a8,GMP_DIV_TRUNC);
  iVar13 = -local_78._mp_size;
  if (0 < local_78._mp_size) {
    iVar13 = local_78._mp_size;
  }
  local_78._mp_size = iVar13;
  uVar16 = -iVar9;
  if (lVar18 != 0) {
    do {
      if (((local_c8._mp_size != 0) && ((*local_c8._mp_d & 1) != 0)) ||
         ((local_b8._mp_size != 0 && ((*local_b8._mp_d & 1) != 0)))) {
        mpz_sub(&local_c8,&local_c8,&local_98);
        mpz_add(&local_b8,&local_b8,&local_78);
      }
      lVar18 = lVar18 + -1;
      mpz_div_q_2exp(&local_c8,&local_c8,1,GMP_DIV_TRUNC);
      mpz_div_q_2exp(&local_b8,&local_b8,1,GMP_DIV_TRUNC);
    } while (lVar18 != 0);
    uVar16 = local_c8._mp_size;
  }
  mpz_add(&local_98,&local_c8,&local_98);
  p_Var8 = local_50;
  p_Var17 = local_60;
  pmVar1 = local_98._mp_d;
  pmVar19 = local_c8._mp_d;
  uVar6 = -uVar16;
  if (0 < (int)uVar16) {
    uVar6 = uVar16;
  }
  iVar9 = local_98._mp_size;
  uVar15 = -local_98._mp_size;
  if (0 < local_98._mp_size) {
    uVar15 = local_98._mp_size;
  }
  if (uVar6 == uVar15) {
    uVar14 = (ulong)uVar6;
    do {
      if ((long)uVar14 < 1) goto LAB_005d0ddc;
      lVar18 = uVar14 - 1;
      lVar7 = uVar14 - 1;
      uVar14 = uVar14 - 1;
    } while (local_c8._mp_d[lVar7] == local_98._mp_d[lVar18]);
    if (local_c8._mp_d[lVar7] <= local_98._mp_d[lVar18]) goto LAB_005d0ddc;
  }
  else if (uVar6 < uVar15) goto LAB_005d0ddc;
  iVar13 = local_c8._mp_alloc;
  local_c8._mp_d = local_98._mp_d;
  local_98._mp_d = pmVar19;
  local_c8._mp_alloc = local_98._mp_alloc;
  local_c8._mp_size = local_98._mp_size;
  local_98._mp_size = uVar16;
  local_98._mp_alloc = iVar13;
  mpz_sub(&local_b8,&local_b8,&local_78);
  pmVar19 = pmVar1;
  uVar16 = iVar9;
LAB_005d0ddc:
  if (local_58->_mp_size < 0) {
    uVar16 = -uVar16;
    local_c8._mp_size = uVar16;
  }
  if (local_48->_mp_size < 0) {
    local_b8._mp_size = -local_b8._mp_size;
  }
  pmVar1 = local_38->_mp_d;
  local_38->_mp_d = local_a8._mp_d;
  uVar2._0_4_ = local_38->_mp_alloc;
  uVar2._4_4_ = local_38->_mp_size;
  local_38->_mp_alloc = local_a8._mp_alloc;
  local_38->_mp_size = local_a8._mp_size;
  puVar20 = pmVar19;
  if (p_Var17 != (__mpz_struct *)0x0) {
    puVar20 = p_Var17->_mp_d;
    p_Var17->_mp_d = pmVar19;
    uVar3._0_4_ = p_Var17->_mp_alloc;
    uVar3._4_4_ = p_Var17->_mp_size;
    p_Var17->_mp_alloc = local_c8._mp_alloc;
    p_Var17->_mp_size = uVar16;
    local_c8._0_8_ = uVar3;
    local_c8._mp_d = puVar20;
  }
  if (p_Var8 != (__mpz_struct *)0x0) {
    puVar4 = p_Var8->_mp_d;
    p_Var8->_mp_d = local_b8._mp_d;
    uVar5._0_4_ = p_Var8->_mp_alloc;
    uVar5._4_4_ = p_Var8->_mp_size;
    p_Var8->_mp_alloc = local_b8._mp_alloc;
    p_Var8->_mp_size = local_b8._mp_size;
    local_b8._0_8_ = uVar5;
    local_b8._mp_d = puVar4;
  }
  local_a8._0_8_ = uVar2;
  local_a8._mp_d = pmVar1;
  if ((long)local_88._mp_alloc == 0) {
    iVar9 = (int)uVar2;
  }
  else {
    (*gmp_free_func)(local_88._mp_d,(long)local_88._mp_alloc << 3);
    iVar9 = local_a8._mp_alloc;
  }
  if (iVar9 != 0) {
    (*gmp_free_func)(local_a8._mp_d,(long)iVar9 << 3);
  }
  if ((long)local_c8._mp_alloc != 0) {
    (*gmp_free_func)(puVar20,(long)local_c8._mp_alloc << 3);
  }
  if ((long)local_98._mp_alloc != 0) {
    (*gmp_free_func)(local_98._mp_d,(long)local_98._mp_alloc << 3);
  }
  if ((long)local_b8._mp_alloc != 0) {
    (*gmp_free_func)(local_b8._mp_d,(long)local_b8._mp_alloc << 3);
  }
  if ((long)local_78._mp_alloc != 0) {
    (*gmp_free_func)(local_78._mp_d,(long)local_78._mp_alloc << 3);
  }
  return;
}

Assistant:

void
mpz_gcdext (mpz_t g, mpz_t s, mpz_t t, const mpz_t u, const mpz_t v)
{
  mpz_t tu, tv, s0, s1, t0, t1;
  mp_bitcnt_t uz, vz, gz;
  mp_bitcnt_t power;

  if (u->_mp_size == 0)
    {
      /* g = 0 u + sgn(v) v */
      signed long sign = mpz_sgn (v);
      mpz_abs (g, v);
      if (s)
	s->_mp_size = 0;
      if (t)
	mpz_set_si (t, sign);
      return;
    }

  if (v->_mp_size == 0)
    {
      /* g = sgn(u) u + 0 v */
      signed long sign = mpz_sgn (u);
      mpz_abs (g, u);
      if (s)
	mpz_set_si (s, sign);
      if (t)
	t->_mp_size = 0;
      return;
    }

  mpz_init (tu);
  mpz_init (tv);
  mpz_init (s0);
  mpz_init (s1);
  mpz_init (t0);
  mpz_init (t1);

  mpz_abs (tu, u);
  uz = mpz_make_odd (tu);
  mpz_abs (tv, v);
  vz = mpz_make_odd (tv);
  gz = GMP_MIN (uz, vz);

  uz -= gz;
  vz -= gz;

  /* Cofactors corresponding to odd gcd. gz handled later. */
  if (tu->_mp_size < tv->_mp_size)
    {
      mpz_swap (tu, tv);
      MPZ_SRCPTR_SWAP (u, v);
      MPZ_PTR_SWAP (s, t);
      MP_BITCNT_T_SWAP (uz, vz);
    }

  /* Maintain
   *
   * u = t0 tu + t1 tv
   * v = s0 tu + s1 tv
   *
   * where u and v denote the inputs with common factors of two
   * eliminated, and det (s0, t0; s1, t1) = 2^p. Then
   *
   * 2^p tu =  s1 u - t1 v
   * 2^p tv = -s0 u + t0 v
   */

  /* After initial division, tu = q tv + tu', we have
   *
   * u = 2^uz (tu' + q tv)
   * v = 2^vz tv
   *
   * or
   *
   * t0 = 2^uz, t1 = 2^uz q
   * s0 = 0,    s1 = 2^vz
   */

  mpz_tdiv_qr (t1, tu, tu, tv);
  mpz_mul_2exp (t1, t1, uz);

  mpz_setbit (s1, vz);
  power = uz + vz;

  if (tu->_mp_size > 0)
    {
      mp_bitcnt_t shift;
      shift = mpz_make_odd (tu);
      mpz_setbit (t0, uz + shift);
      power += shift;

      for (;;)
	{
	  int c;
	  c = mpz_cmp (tu, tv);
	  if (c == 0)
	    break;

	  if (c < 0)
	    {
	      /* tv = tv' + tu
	       *
	       * u = t0 tu + t1 (tv' + tu) = (t0 + t1) tu + t1 tv'
	       * v = s0 tu + s1 (tv' + tu) = (s0 + s1) tu + s1 tv' */

	      mpz_sub (tv, tv, tu);
	      mpz_add (t0, t0, t1);
	      mpz_add (s0, s0, s1);

	      shift = mpz_make_odd (tv);
	      mpz_mul_2exp (t1, t1, shift);
	      mpz_mul_2exp (s1, s1, shift);
	    }
	  else
	    {
	      mpz_sub (tu, tu, tv);
	      mpz_add (t1, t0, t1);
	      mpz_add (s1, s0, s1);

	      shift = mpz_make_odd (tu);
	      mpz_mul_2exp (t0, t0, shift);
	      mpz_mul_2exp (s0, s0, shift);
	    }
	  power += shift;
	}
    }
  else
    mpz_setbit (t0, uz);

  /* Now tv = odd part of gcd, and -s0 and t0 are corresponding
     cofactors. */

  mpz_mul_2exp (tv, tv, gz);
  mpz_neg (s0, s0);

  /* 2^p g = s0 u + t0 v. Eliminate one factor of two at a time. To
     adjust cofactors, we need u / g and v / g */

  mpz_divexact (s1, v, tv);
  mpz_abs (s1, s1);
  mpz_divexact (t1, u, tv);
  mpz_abs (t1, t1);

  while (power-- > 0)
    {
      /* s0 u + t0 v = (s0 - v/g) u - (t0 + u/g) v */
      if (mpz_odd_p (s0) || mpz_odd_p (t0))
	{
	  mpz_sub (s0, s0, s1);
	  mpz_add (t0, t0, t1);
	}
      assert (mpz_even_p (t0) && mpz_even_p (s0));
      mpz_tdiv_q_2exp (s0, s0, 1);
      mpz_tdiv_q_2exp (t0, t0, 1);
    }

  /* Arrange so that |s| < |u| / 2g */
  mpz_add (s1, s0, s1);
  if (mpz_cmpabs (s0, s1) > 0)
    {
      mpz_swap (s0, s1);
      mpz_sub (t0, t0, t1);
    }
  if (u->_mp_size < 0)
    mpz_neg (s0, s0);
  if (v->_mp_size < 0)
    mpz_neg (t0, t0);

  mpz_swap (g, tv);
  if (s)
    mpz_swap (s, s0);
  if (t)
    mpz_swap (t, t0);

  mpz_clear (tu);
  mpz_clear (tv);
  mpz_clear (s0);
  mpz_clear (s1);
  mpz_clear (t0);
  mpz_clear (t1);
}